

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  int64_t *piVar1;
  long lVar2;
  int64_t *piVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  byte bVar8;
  ushort uVar9;
  short sVar10;
  uint uVar11;
  undefined4 uVar12;
  rar *rar;
  bool bVar13;
  short *psVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  wchar_t wVar18;
  int iVar19;
  archive_string_conv *paVar20;
  short *psVar21;
  uLong uVar22;
  uint *buf;
  time_t tVar23;
  ulong uVar24;
  void *pvVar25;
  char *pcVar26;
  size_t sVar27;
  archive_string_conv *paVar28;
  data_block_offsets *pdVar29;
  int *piVar30;
  byte bVar31;
  mode_t mVar32;
  uint uVar33;
  ulong uVar34;
  char *pcVar35;
  size_t __n;
  uint uVar36;
  char *pcVar37;
  byte bVar38;
  char cVar39;
  char cVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  size_t newsize;
  char *endp;
  uint p0;
  archive_string_conv *local_88;
  
  rar = (rar *)a->format->data;
  paVar20 = rar->opt_sconv;
  if (paVar20 == (archive_string_conv *)0x0) {
    if (rar->init_default_conversion == 0) {
      paVar20 = archive_string_default_conversion_for_read(&a->archive);
      rar->sconv_default = paVar20;
      rar->init_default_conversion = 1;
    }
    paVar20 = rar->sconv_default;
  }
  psVar21 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (psVar21 == (short *)0x0) {
    return -0x1e;
  }
  sVar10 = *psVar21;
  uVar9 = *(ushort *)((long)psVar21 + 5);
  uVar34 = (ulong)uVar9;
  rar->file_flags = (uint)*(ushort *)((long)psVar21 + 3);
  if (uVar9 < 0x20) {
    pcVar35 = "Invalid header size";
  }
  else {
    uVar22 = cm_zlib_crc32(0,(uchar *)(psVar21 + 1),5);
    __archive_read_consume(a,7);
    if ((rar->file_flags & 0x10) == 0) {
      rar->compression_method = '\0';
      rar->packed_size = 0;
      rar->unp_size = 0;
      rar->mtime = 0;
      rar->mnsec = 0;
      rar->mode = 0;
      rar->salt[0] = '\0';
      rar->salt[1] = '\0';
      rar->salt[2] = '\0';
      rar->salt[3] = '\0';
      rar->salt[4] = '\0';
      rar->salt[5] = '\0';
      rar->salt[6] = '\0';
      rar->salt[7] = '\0';
      rar->atime = 0;
      rar->ansec = 0;
      rar->ctime = 0;
      rar->cnsec = 0;
      rar->arctime = 0;
      rar->arcnsec = 0;
      buf = (uint *)__archive_read_ahead(a,uVar34 - 7,(ssize_t *)0x0);
      if (buf == (uint *)0x0) {
        return -0x1e;
      }
      uVar22 = cm_zlib_crc32(uVar22,(uchar *)buf,(uint)(uVar34 - 7));
      if (sVar10 == (short)uVar22) {
        uVar33 = *buf;
        uVar11 = buf[1];
        uVar24 = (ulong)uVar11;
        uVar15 = buf[2];
        bVar38 = *(byte *)((long)buf + 0x13);
        uVar36 = buf[5];
        bVar4 = *(byte *)((long)buf + 0x15);
        bVar5 = *(byte *)((long)buf + 0x16);
        bVar6 = *(byte *)((long)buf + 0x17);
        uVar16 = buf[6];
        iVar17 = *(int *)((long)buf + 0xd);
        uVar43 = *(uint *)((long)buf + 9);
        rar->compression_method = *(char *)((long)buf + 0x12);
        tVar23 = get_time(iVar17);
        rar->mtime = tVar23;
        rar->file_crc = (ulong)uVar43;
        if ((rar->file_flags & 4) != 0) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          rar->has_encrypted_entries = 1;
          archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
        }
        piVar1 = &rar->packed_size;
        if ((rar->file_flags & 0x100) == 0) {
          pcVar35 = (char *)((long)buf + 0x19);
          *piVar1 = (ulong)uVar33;
        }
        else {
          pcVar35 = (char *)((long)buf + 0x21);
          uVar12 = *(undefined4 *)((long)buf + 0x1d);
          *piVar1 = (ulong)(uVar33 & 0xff00) |
                    CONCAT44(*(undefined4 *)((long)buf + 0x19),uVar33) & 0xffffffffffff0000 |
                    (ulong)uVar33 & 0xff;
          uVar24 = (ulong)(uVar11 & 0xff00) | CONCAT44(uVar12,uVar11) & 0xffffffffffff0000 |
                   uVar24 & 0xff;
        }
        rar->unp_size = uVar24;
        lVar41 = rar->packed_size;
        if ((lVar41 < 0) || ((long)uVar24 < 0)) {
          pcVar35 = "Invalid sizes specified.";
        }
        else {
          lVar2 = uVar34 + (long)buf;
          rar->bytes_remaining = lVar41;
          uVar24 = uVar34;
          if (head_type == 'z') {
            uVar24 = lVar41 + uVar34;
            pvVar25 = __archive_read_ahead(a,(uVar34 + lVar41) - 7,(ssize_t *)0x0);
            pcVar35 = (char *)(((long)pcVar35 - (long)buf) + (long)pvVar25);
            lVar2 = (long)pvVar25 + uVar24;
            if (pvVar25 == (void *)0x0) {
              return -0x1e;
            }
          }
          endp = (char *)(lVar2 + -7);
          __n = (ulong)(byte)uVar36 * 0x100 + (ulong)bVar38;
          pcVar37 = pcVar35 + __n;
          if (pcVar37 <= endp) {
            uVar33 = (uint)__n;
            uVar34 = (ulong)(uVar33 * 2 + 2);
            if (rar->filename_allocated < uVar34) {
              pcVar26 = (char *)realloc(rar->filename,uVar34);
              if (pcVar26 == (char *)0x0) {
                archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                return -0x1e;
              }
              rar->filename = pcVar26;
              rar->filename_allocated = uVar34;
            }
            psVar21 = (short *)rar->filename;
            memcpy(psVar21,pcVar35,__n);
            *(undefined1 *)((long)psVar21 + __n) = 0;
            if ((rar->file_flags & 0x200) == 0) {
              while (pcVar35 = strchr((char *)psVar21,0x5c), local_88 = paVar20,
                    pcVar35 != (char *)0x0) {
                *pcVar35 = '/';
              }
            }
            else {
              sVar27 = strlen((char *)psVar21);
              if (sVar27 == __n) {
                if (rar->sconv_utf8 == (archive_string_conv *)0x0) {
                  paVar28 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
                  rar->sconv_utf8 = paVar28;
                  if (paVar28 == (archive_string_conv *)0x0) {
                    return -0x1e;
                  }
                }
                local_88 = rar->sconv_utf8;
                while (pcVar35 = strchr((char *)psVar21,0x5c), pcVar35 != (char *)0x0) {
                  *pcVar35 = '/';
                }
              }
              else {
                uVar11 = uVar33 * 2;
                uVar43 = (int)sVar27 + 2;
                uVar34 = 0;
                if (uVar43 < uVar33) {
                  cVar7 = pcVar35[(int)sVar27 + 1];
                  bVar38 = 0;
                  bVar31 = 0;
                  uVar34 = 0;
                  local_88 = (archive_string_conv *)CONCAT71(local_88._1_7_,cVar7);
                  do {
                    if (bVar31 == 0) {
                      uVar42 = (ulong)uVar43;
                      uVar43 = uVar43 + 1;
                      bVar38 = pcVar35[uVar42];
                      bVar31 = 8;
                    }
                    bVar31 = bVar31 - 2;
                    uVar36 = (uint)uVar34;
                    switch(bVar38 >> (bVar31 & 0x1f) & 3) {
                    case 0:
                      *(undefined1 *)((long)psVar21 + uVar34) = 0;
                      goto LAB_00488b3f;
                    case 1:
                      *(char *)((long)psVar21 + uVar34) = cVar7;
LAB_00488b3f:
                      uVar42 = (ulong)uVar43;
                      uVar43 = uVar43 + 1;
                      uVar34 = (ulong)(uVar36 + 2);
                      *(char *)((long)psVar21 + (long)(int)uVar36 + 1) = pcVar35[uVar42];
                      break;
                    case 2:
                      *(char *)((long)psVar21 + uVar34) = pcVar35[(ulong)uVar43 + 1];
                      uVar34 = (ulong)(uVar36 + 2);
                      *(char *)((long)psVar21 + (long)(int)uVar36 + 1) = pcVar35[uVar43];
                      uVar43 = uVar43 + 2;
                      break;
                    case 3:
                      bVar8 = pcVar35[uVar43];
                      lVar41 = (ulong)uVar43 + 1;
                      if ((char)bVar8 < '\0') {
                        uVar43 = uVar43 + 2;
                        cVar39 = pcVar35[lVar41];
                        cVar40 = cVar7;
                      }
                      else {
                        cVar39 = '\0';
                        uVar43 = (uint)lVar41;
                        cVar40 = '\0';
                      }
                      if (uVar36 < uVar11) {
                        uVar42 = (ulong)(int)uVar36;
                        lVar41 = 0;
                        do {
                          *(char *)((long)psVar21 + lVar41 * 2 + uVar42) = cVar40;
                          *(char *)((long)psVar21 + lVar41 * 2 + uVar42 + 1) =
                               pcVar35[(int)(uVar42 >> 1) + (int)lVar41 & 0x7fffffff] + cVar39;
                          uVar36 = (int)uVar34 + 2;
                          uVar34 = (ulong)uVar36;
                          if ((byte)((bVar8 & 0x7f) + 1) == (char)lVar41) break;
                          lVar41 = lVar41 + 1;
                        } while (uVar36 < uVar11);
                      }
                    }
                  } while ((uVar43 < uVar33) && ((uint)uVar34 < uVar11));
                }
                uVar33 = (uint)uVar34;
                pcVar37 = pcVar35;
                if (uVar11 < uVar33) {
                  bVar13 = false;
                  archive_set_error(&a->archive,0x54,"Invalid filename");
                }
                else {
                  uVar33 = uVar33 + 1;
                  *(undefined2 *)((long)psVar21 + uVar34) = 0;
                  if (rar->sconv_utf16be == (archive_string_conv *)0x0) {
                    paVar28 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01')
                    ;
                    rar->sconv_utf16be = paVar28;
                    if (paVar28 == (archive_string_conv *)0x0) {
                      bVar13 = false;
                      goto LAB_00488ca5;
                    }
                  }
                  local_88 = rar->sconv_utf16be;
                  sVar10 = *psVar21;
                  psVar14 = psVar21;
                  while (sVar10 != 0) {
                    if (*psVar14 == 0x5c00) {
                      *(undefined1 *)((long)psVar14 + 1) = 0x2f;
                    }
                    sVar10 = psVar14[1];
                    psVar14 = psVar14 + 1;
                  }
                  bVar13 = true;
                  pcVar37 = pcVar35 + uVar43;
                }
LAB_00488ca5:
                __n = (size_t)uVar33;
                if (!bVar13) {
                  return -0x1e;
                }
              }
            }
            pcVar35 = rar->filename_save;
            if (((pcVar35 == (char *)0x0) || (rar->filename_save_size != __n)) ||
               (iVar17 = bcmp(rar->filename,pcVar35,(ulong)((int)__n + 1)), iVar17 != 0)) {
              uVar34 = (ulong)((int)__n + 1);
              pcVar35 = (char *)realloc(pcVar35,uVar34);
              rar->filename_save = pcVar35;
              memcpy(pcVar35,rar->filename,uVar34);
              rar->filename_save_size = __n;
              free(rar->dbo);
              pdVar29 = (data_block_offsets *)calloc(1,0x18);
              rar->dbo = pdVar29;
              if (pdVar29 == (data_block_offsets *)0x0) {
                pcVar35 = "Couldn\'t allocate memory.";
              }
              else {
                pdVar29->header_size = uVar24;
                *(undefined4 *)&pdVar29->start_offset = 0xffffffff;
                *(undefined4 *)((long)&pdVar29->start_offset + 4) = 0xffffffff;
                *(undefined4 *)&pdVar29->end_offset = 0xffffffff;
                *(undefined4 *)((long)&pdVar29->end_offset + 4) = 0xffffffff;
                rar->cursor = 0;
                rar->nodes = 1;
                if ((rar->file_flags & 0x400) != 0) {
                  if (endp < pcVar37 + 8) {
                    pcVar35 = "Invalid header size";
                    goto LAB_0048875e;
                  }
                  *(undefined8 *)rar->salt = *(undefined8 *)pcVar37;
                  pcVar37 = pcVar37 + 8;
                }
                if (((rar->file_flags & 0x1000) != 0) &&
                   (iVar17 = read_exttime(pcVar37,rar,endp), iVar17 < 0)) {
                  pcVar35 = "Invalid header size";
                  goto LAB_0048875e;
                }
                __archive_read_consume(a,uVar24 - 7);
                lVar41 = a->filter->position;
                pdVar29 = rar->dbo;
                pdVar29->start_offset = lVar41;
                pdVar29->end_offset = lVar41 + rar->packed_size;
                if ((byte)uVar15 - 3 < 3) {
                  mVar32 = (uint)bVar5 * 0x100 + (uint)bVar4 | (uint)bVar6 << 0x10 |
                           (uint)(byte)uVar16 << 0x18;
                }
                else {
                  if (2 < (byte)uVar15) {
                    pcVar35 = "Unknown file attributes from RAR file\'s host OS";
                    goto LAB_0048875e;
                  }
                  uVar33 = 0x4049;
                  if ((bVar4 & 0x10) == 0) {
                    uVar33 = 0x8000;
                  }
                  rar->mode = uVar33;
                  mVar32 = uVar33 | 0x1a4;
                }
                rar->mode = mVar32;
                rar->bytes_unconsumed = 0;
                (rar->lzss).position = 0;
                rar->dictionary_size = 0;
                (rar->br).cache_avail = 0;
                (rar->br).avail_in = 0;
                rar->crc_calculated = 0;
                rar->entry_eof = '\0';
                rar->bytes_uncopied = 0;
                rar->offset = 0;
                rar->offset_outgoing = 0;
                rar->offset_seek = 0;
                rar->valid = '\x01';
                rar->is_ppmd_block = '\0';
                rar->start_new_table = '\x01';
                free(rar->unp_buffer);
                rar->unp_buffer = (uchar *)0x0;
                rar->unp_offset = 0;
                rar->unp_buffer_size = 0x20000;
                memset(rar->lengthtable,0,0x194);
                Ppmd7_Free(&rar->ppmd7_context);
                rar->ppmd_valid = '\0';
                rar->ppmd_eod = '\0';
                if (head_type == 'z') {
                  return 0;
                }
                archive_entry_set_mtime(entry,rar->mtime,rar->mnsec);
                archive_entry_set_ctime(entry,rar->ctime,rar->cnsec);
                archive_entry_set_atime(entry,rar->atime,rar->ansec);
                archive_entry_set_size(entry,rar->unp_size);
                archive_entry_set_mode(entry,rar->mode);
                wVar18 = _archive_entry_copy_pathname_l(entry,(char *)psVar21,__n,local_88);
                if (wVar18 == L'\0') {
                  iVar17 = 0;
LAB_00488fc5:
                  iVar19 = iVar17;
                  if ((rar->mode & 0xf000) == 0xa000) {
                    rar->bytes_remaining = 0;
                    archive_entry_set_size(entry,0);
                    iVar19 = read_symlink_stored(a,entry,paVar20);
                    if (iVar19 < -0x14) {
                      return iVar19;
                    }
                    if (iVar17 < iVar19) {
                      iVar19 = iVar17;
                    }
                  }
                  if (rar->bytes_remaining == 0) {
                    rar->entry_eof = '\x01';
                    return iVar19;
                  }
                  return iVar19;
                }
                piVar30 = __errno_location();
                if (*piVar30 != 0xc) {
                  pcVar35 = archive_string_conversion_charset_name(local_88);
                  archive_set_error(&a->archive,0x54,
                                    "Pathname cannot be converted from %s to current locale.",
                                    pcVar35);
                  iVar17 = -0x14;
                  goto LAB_00488fc5;
                }
                pcVar35 = "Can\'t allocate memory for Pathname";
              }
            }
            else {
              __archive_read_consume(a,uVar24 - 7);
              uVar33 = rar->cursor + 1;
              rar->cursor = uVar33;
              if (uVar33 < rar->nodes) {
LAB_00488f3a:
                pdVar29 = rar->dbo;
                uVar33 = rar->cursor;
                if (pdVar29[uVar33].start_offset < 0) {
                  pdVar29[uVar33].start_offset = a->filter->position;
                  pdVar29[uVar33].end_offset = *piVar1 + pdVar29[uVar33].start_offset;
                  return 0;
                }
                return 0;
              }
              uVar33 = rar->nodes + 1;
              rar->nodes = uVar33;
              pdVar29 = (data_block_offsets *)realloc(rar->dbo,(ulong)uVar33 * 0x18);
              rar->dbo = pdVar29;
              if (pdVar29 != (data_block_offsets *)0x0) {
                uVar33 = rar->cursor;
                pdVar29[uVar33].header_size = uVar24;
                piVar3 = &pdVar29[uVar33].start_offset;
                *(undefined4 *)piVar3 = 0xffffffff;
                *(undefined4 *)((long)piVar3 + 4) = 0xffffffff;
                *(undefined4 *)(piVar3 + 1) = 0xffffffff;
                *(undefined4 *)((long)piVar3 + 0xc) = 0xffffffff;
                goto LAB_00488f3a;
              }
              pcVar35 = "Couldn\'t allocate memory.";
            }
            iVar17 = 0xc;
            goto LAB_00488763;
          }
          pcVar35 = "Invalid filename size";
        }
      }
      else {
        pcVar35 = "Header CRC error";
      }
    }
    else {
      pcVar35 = "RAR solid archive support unavailable.";
    }
  }
LAB_0048875e:
  iVar17 = 0x54;
LAB_00488763:
  archive_set_error(&a->archive,iVar17,pcVar35);
  return -0x1e;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}